

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O0

void __thiscall
vkt::sr::ShaderRenderCaseInstance::SparseContext::SparseContext
          (SparseContext *this,Context *context)

{
  RefData<vk::VkDevice_s_*> data;
  deUint32 dVar1;
  InstanceInterface *pIVar2;
  VkPhysicalDevice physicalDevice;
  VkDevice_s **ppVVar3;
  VkQueue pVVar4;
  Allocator *pAVar5;
  DefaultDeleter<vk::Allocator> local_55 [13];
  Move<vk::VkDevice_s_*> local_48;
  RefData<vk::VkDevice_s_*> local_30;
  Context *local_18;
  Context *context_local;
  SparseContext *this_local;
  
  this->m_context = context;
  local_18 = context;
  context_local = (Context *)this;
  pIVar2 = Context::getInstanceInterface(context);
  physicalDevice = Context::getPhysicalDevice(local_18);
  dVar1 = findQueueFamilyIndexWithCaps(pIVar2,physicalDevice,9);
  this->m_queueFamilyIndex = dVar1;
  createDevice(&local_48,this);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_30,(Move *)&local_48);
  data.deleter.m_destroyDevice = local_30.deleter.m_destroyDevice;
  data.object = local_30.object;
  data.deleter.m_allocator = local_30.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::VkDevice_s_*>::Unique(&this->m_device,data);
  ::vk::refdetails::Move<vk::VkDevice_s_*>::~Move(&local_48);
  pIVar2 = Context::getInstanceInterface(local_18);
  ppVVar3 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                      (&(this->m_device).super_RefBase<vk::VkDevice_s_*>);
  ::vk::DeviceDriver::DeviceDriver(&this->m_deviceInterface,pIVar2,*ppVVar3);
  ppVVar3 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                      (&(this->m_device).super_RefBase<vk::VkDevice_s_*>);
  pVVar4 = ::vk::getDeviceQueue
                     (&(this->m_deviceInterface).super_DeviceInterface,*ppVVar3,
                      this->m_queueFamilyIndex,0);
  this->m_queue = pVVar4;
  pAVar5 = createAllocator(this);
  de::DefaultDeleter<vk::Allocator>::DefaultDeleter(local_55);
  de::details::UniquePtr<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>::UniquePtr
            (&this->m_allocator,pAVar5);
  return;
}

Assistant:

ShaderRenderCaseInstance::SparseContext::SparseContext (vkt::Context& context)
	: m_context				(context)
	, m_queueFamilyIndex	(findQueueFamilyIndexWithCaps(context.getInstanceInterface(), context.getPhysicalDevice(), VK_QUEUE_GRAPHICS_BIT|VK_QUEUE_SPARSE_BINDING_BIT))
	, m_device				(createDevice())
	, m_deviceInterface		(context.getInstanceInterface(), *m_device)
	, m_queue				(getDeviceQueue(m_deviceInterface, *m_device, m_queueFamilyIndex, 0))
	, m_allocator			(createAllocator())
{
}